

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O0

deBool __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchInstanceBufferUpload::verifyResultBuffer
          (IndirectDispatchInstanceBufferUpload *this,Buffer *resultBuffer,
          VkDeviceSize resultBlockSize,VkDeviceSize resultBufferSize)

{
  uint uVar1;
  uint uVar2;
  DeviceInterface *vkd;
  VkDevice device;
  VkDeviceSize offset;
  ulong uVar3;
  size_type sVar4;
  uint *puVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  MessageBuilder local_1f8;
  TestContext *local_78;
  TestContext *testCtx;
  deUint32 expectedCount;
  deUint32 numGroups;
  deUint32 numInvocationsPerGroup;
  deUint32 numPassed;
  deUint8 *srcPtr;
  DispatchCommand *cmd;
  void *pvStack_48;
  deUint32 cmdNdx;
  deUint8 *resultDataPtr;
  Allocation *local_38;
  Allocation *alloc;
  VkDeviceSize VStack_28;
  deBool allOk;
  VkDeviceSize resultBufferSize_local;
  VkDeviceSize resultBlockSize_local;
  Buffer *resultBuffer_local;
  IndirectDispatchInstanceBufferUpload *this_local;
  
  alloc._4_4_ = 1;
  VStack_28 = resultBufferSize;
  resultBufferSize_local = resultBlockSize;
  resultBlockSize_local = (VkDeviceSize)resultBuffer;
  resultBuffer_local = (Buffer *)this;
  local_38 = compute::Buffer::getAllocation(resultBuffer);
  vkd = this->m_device_interface;
  device = this->m_device;
  resultDataPtr = (deUint8 *)::vk::Allocation::getMemory(local_38);
  offset = ::vk::Allocation::getOffset(local_38);
  ::vk::invalidateMappedMemoryRange(vkd,device,(VkDeviceMemory)resultDataPtr,offset,VStack_28);
  pvStack_48 = ::vk::Allocation::getHostPtr(local_38);
  cmd._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)cmd._4_4_;
    sVar4 = std::
            vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ::size(&this->m_dispatchCommands);
    if (sVar4 <= uVar3) break;
    srcPtr = (deUint8 *)
             std::
             vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
             ::operator[](&this->m_dispatchCommands,(ulong)cmd._4_4_);
    _numInvocationsPerGroup = (void *)((long)pvStack_48 + cmd._4_4_ * resultBufferSize_local);
    numGroups = *(deUint32 *)((long)_numInvocationsPerGroup + 0xc);
    puVar5 = tcu::Vector<unsigned_int,_3>::operator[](&this->m_workGroupSize,0);
    uVar1 = *puVar5;
    puVar5 = tcu::Vector<unsigned_int,_3>::operator[](&this->m_workGroupSize,1);
    uVar2 = *puVar5;
    puVar5 = tcu::Vector<unsigned_int,_3>::operator[](&this->m_workGroupSize,2);
    expectedCount = uVar1 * uVar2 * *puVar5;
    puVar5 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)(srcPtr + 8),0);
    uVar1 = *puVar5;
    puVar5 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)(srcPtr + 8),1);
    uVar2 = *puVar5;
    puVar5 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)(srcPtr + 8),2);
    testCtx._4_4_ = uVar1 * uVar2 * *puVar5;
    testCtx._0_4_ = expectedCount * testCtx._4_4_;
    if (numGroups != (deUint32)testCtx) {
      local_78 = Context::getTestContext(this->m_context);
      this_00 = tcu::TestContext::getLog(local_78);
      tcu::TestLog::operator<<(&local_1f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1f8,(char (*) [42])"ERROR: got invalid result for invocation ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)&cmd + 4));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])": got numPassed = ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&numGroups);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])0x1367f41);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&testCtx);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f8);
      alloc._4_4_ = 0;
    }
    cmd._4_4_ = cmd._4_4_ + 1;
  }
  return alloc._4_4_;
}

Assistant:

deBool IndirectDispatchInstanceBufferUpload::verifyResultBuffer (const Buffer&			resultBuffer,
																 const vk::VkDeviceSize	resultBlockSize,
																 const vk::VkDeviceSize	resultBufferSize) const
{
	deBool allOk = true;
	const vk::Allocation& alloc = resultBuffer.getAllocation();
	vk::invalidateMappedMemoryRange(m_device_interface, m_device, alloc.getMemory(), alloc.getOffset(), resultBufferSize);

	const deUint8* const resultDataPtr = reinterpret_cast<deUint8*>(alloc.getHostPtr());

	for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); cmdNdx++)
	{
		const DispatchCommand&	cmd = m_dispatchCommands[cmdNdx];
		const deUint8* const	srcPtr = (const deUint8*)resultDataPtr + cmdNdx*resultBlockSize;
		const deUint32			numPassed = *(const deUint32*)(srcPtr + RESULT_BLOCK_NUM_PASSED_OFFSET);
		const deUint32			numInvocationsPerGroup = m_workGroupSize[0] * m_workGroupSize[1] * m_workGroupSize[2];
		const deUint32			numGroups = cmd.m_numWorkGroups[0] * cmd.m_numWorkGroups[1] * cmd.m_numWorkGroups[2];
		const deUint32			expectedCount = numInvocationsPerGroup * numGroups;

		if (numPassed != expectedCount)
		{
			tcu::TestContext& testCtx = m_context.getTestContext();

			testCtx.getLog()
				<< tcu::TestLog::Message
				<< "ERROR: got invalid result for invocation " << cmdNdx
				<< ": got numPassed = " << numPassed << ", expected " << expectedCount
				<< tcu::TestLog::EndMessage;

			allOk = false;
		}
	}

	return allOk;
}